

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameExistsAndWasSet::Run(void)

{
  bool bVar1;
  char *value_00;
  allocator local_51;
  FlagSaver fs;
  string value;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  value_00 = "NameExistsAndWasSet";
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineOptionTest");
  SetCommandLineOption_abi_cxx11_(&local_28,(gflags *)0x14c7dc,"700",value_00);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&value,"will be changed",&local_51);
  bVar1 = GetCommandLineOption("test_int32",&value);
  if (bVar1) {
    bVar1 = std::operator==("700",&value);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&value);
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","\"700\"","==","value");
  }
  else {
    fprintf(_stderr,"Check failed: %s\n","r");
  }
  exit(1);
}

Assistant:

TEST(GetCommandLineOptionTest, NameExistsAndWasSet) {
  SetCommandLineOption("test_int32", "700");
  string value("will be changed");
  const bool r = GetCommandLineOption("test_int32", &value);
  EXPECT_TRUE(r);
  EXPECT_EQ("700", value);
}